

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::ScopedPrematureExitFile::~ScopedPrematureExitFile(ScopedPrematureExitFile *this)

{
  int iVar1;
  ostream *poVar2;
  GTestLog local_14;
  
  if ((this->premature_exit_filepath_)._M_string_length != 0) {
    iVar1 = remove((this->premature_exit_filepath_)._M_dataplus._M_p);
    if (iVar1 != 0) {
      GTestLog::GTestLog(&local_14,GTEST_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/hansen-audio[P]aligned-allocator/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                         ,0x130f);
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to remove premature exit filepath \"");
      poVar2 = std::operator<<(poVar2,(string *)this);
      poVar2 = std::operator<<(poVar2,"\" with error ");
      std::ostream::operator<<(poVar2,iVar1);
      GTestLog::~GTestLog(&local_14);
    }
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~ScopedPrematureExitFile() {
#if !defined GTEST_OS_ESP8266
    if (!premature_exit_filepath_.empty()) {
      int retval = remove(premature_exit_filepath_.c_str());
      if (retval) {
        GTEST_LOG_(ERROR) << "Failed to remove premature exit filepath \""
                          << premature_exit_filepath_ << "\" with error "
                          << retval;
      }
    }
#endif
  }